

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O1

void av1_save_layer_context(AV1_COMP *cpi)

{
  uint *puVar1;
  LAYER_CONTEXT *__dest;
  byte bVar2;
  uint uVar3;
  LAYER_CONTEXT *pLVar4;
  CYCLIC_REFRESH *pCVar5;
  int8_t *piVar6;
  int iVar7;
  long lVar8;
  uint i;
  
  pLVar4 = (cpi->svc).layer_context;
  lVar8 = (long)(cpi->svc).temporal_layer_id +
          (long)(cpi->svc).number_temporal_layers * (long)(cpi->svc).spatial_layer_id;
  __dest = pLVar4 + lVar8;
  memcpy(__dest,&cpi->rc,0x140);
  memcpy(&pLVar4[lVar8].p_rc,&cpi->ppi->p_rc,0x31d8);
  pLVar4[lVar8].target_bandwidth = (long)(int)(cpi->oxcf).rc_cfg.target_bandwidth;
  pLVar4[lVar8].group_index = cpi->gf_frame_index;
  pLVar4[lVar8].max_mv_magnitude = (cpi->mv_search_params).max_mv_magnitude;
  if ((cpi->svc).spatial_layer_id == 0) {
    (cpi->svc).base_framerate = cpi->framerate;
  }
  if ((((cpi->oxcf).q_cfg.aq_mode == '\x03') && (1 < (cpi->svc).number_spatial_layers)) &&
     ((cpi->svc).temporal_layer_id == 0)) {
    pCVar5 = cpi->cyclic_refresh;
    piVar6 = __dest->map;
    __dest->map = pCVar5->map;
    pCVar5->map = piVar6;
    __dest->sb_index = pCVar5->sb_index;
    iVar7 = pCVar5->actual_num_seg2_blocks;
    __dest->actual_num_seg1_blocks = pCVar5->actual_num_seg1_blocks;
    __dest->actual_num_seg2_blocks = iVar7;
    __dest->counter_encode_maxq_scene_change = pCVar5->counter_encode_maxq_scene_change;
  }
  if (cpi->is_dropped_frame == false) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    bVar2 = (cpi->common).current_frame.frame_type;
    lVar8 = 0;
    do {
      if (((bVar2 & 0xfd) == 0) ||
         (((uint)(cpi->common).current_frame.refresh_frame_flags >> ((uint)lVar8 & 0x1f) & 1) != 0))
      {
        (cpi->svc).spatial_layer_fb[lVar8] = (cpi->svc).spatial_layer_id;
        (cpi->svc).temporal_layer_fb[lVar8] = (cpi->svc).temporal_layer_id;
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
  }
  uVar3 = (cpi->svc).number_spatial_layers;
  if (((cpi->svc).spatial_layer_id == uVar3 - 1) &&
     (puVar1 = &(cpi->svc).current_superframe, *puVar1 = *puVar1 + 1, 0 < (int)uVar3)) {
    memset((cpi->svc).drop_spatial_layer,0,(ulong)uVar3);
    return;
  }
  return;
}

Assistant:

void av1_save_layer_context(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  const AV1_COMMON *const cm = &cpi->common;
  LAYER_CONTEXT *lc = get_layer_context(cpi);
  lc->rc = cpi->rc;
  lc->p_rc = cpi->ppi->p_rc;
  lc->target_bandwidth = (int)cpi->oxcf.rc_cfg.target_bandwidth;
  lc->group_index = cpi->gf_frame_index;
  lc->max_mv_magnitude = cpi->mv_search_params.max_mv_magnitude;
  if (svc->spatial_layer_id == 0) svc->base_framerate = cpi->framerate;
  // For spatial-svc, allow cyclic-refresh to be applied on the spatial layers,
  // for the base temporal layer.
  if (cpi->oxcf.q_cfg.aq_mode == CYCLIC_REFRESH_AQ &&
      cpi->svc.number_spatial_layers > 1 && svc->temporal_layer_id == 0) {
    CYCLIC_REFRESH *const cr = cpi->cyclic_refresh;
    signed char *temp = lc->map;
    lc->map = cr->map;
    cr->map = temp;
    lc->sb_index = cr->sb_index;
    lc->actual_num_seg1_blocks = cr->actual_num_seg1_blocks;
    lc->actual_num_seg2_blocks = cr->actual_num_seg2_blocks;
    lc->counter_encode_maxq_scene_change = cr->counter_encode_maxq_scene_change;
  }
  if (!cpi->is_dropped_frame) {
    av1_svc_update_buffer_slot_refreshed(cpi);
    for (unsigned int i = 0; i < REF_FRAMES; i++) {
      if (frame_is_intra_only(cm) ||
          cm->current_frame.refresh_frame_flags & (1 << i)) {
        svc->spatial_layer_fb[i] = svc->spatial_layer_id;
        svc->temporal_layer_fb[i] = svc->temporal_layer_id;
      }
    }
  }
  if (svc->spatial_layer_id == svc->number_spatial_layers - 1) {
    svc->current_superframe++;
    // Reset drop flag to false for next superframe.
    for (int sl = 0; sl < svc->number_spatial_layers; sl++)
      svc->drop_spatial_layer[sl] = false;
  }
}